

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void check_op<std::less>(void)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t __n;
  char *pcVar5;
  long lVar6;
  AssertionResult gtest_ar;
  string_view rhs;
  string_view lhs;
  less<fmt::v5::basic_string_view<char>_> local_79;
  Message local_78;
  AssertHelper local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_58;
  basic_string_view<char> local_50;
  basic_string_view<char> local_40;
  
  local_58 = 0;
  do {
    __s = (&PTR_anon_var_dwarf_2fdda_001d39c0)[local_58];
    lVar6 = 0;
    do {
      local_40.data_ = __s;
      sVar3 = strlen(__s);
      pcVar5 = *(char **)((long)&PTR_anon_var_dwarf_2fdda_001d39c0 + lVar6);
      local_50.data_ = pcVar5;
      local_40.size_ = sVar3;
      sVar4 = strlen(pcVar5);
      __n = sVar4;
      if (sVar3 < sVar4) {
        __n = sVar3;
      }
      local_50.size_ = sVar4;
      if (__n == 0) {
LAB_00120bec:
        iVar2 = -(uint)(sVar3 < sVar4);
        if (sVar3 == sVar4) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = memcmp(__s,pcVar5,__n);
        if (iVar2 == 0) goto LAB_00120bec;
      }
      local_78.ss_.ptr_._0_1_ = (byte)((uint)iVar2 >> 0x1f);
      local_70.data_._0_1_ =
           std::less<fmt::v5::basic_string_view<char>_>::operator()(&local_79,&local_40,&local_50);
      testing::internal::CmpHelperEQ<bool,bool>
                (local_68,"Op<int>()(lhs.compare(rhs), 0)","Op<string_view>()(lhs, rhs)",
                 (bool *)&local_78,(bool *)&local_70);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message(&local_78);
        pcVar5 = "";
        if (local_60.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((local_60.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                   ,0x1aa,pcVar5);
        testing::internal::AssertHelper::operator=(&local_70,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (CONCAT71(local_78.ss_.ptr_._1_7_,(byte)local_78.ss_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT71(local_78.ss_.ptr_._1_7_,(byte)local_78.ss_.ptr_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(local_78.ss_.ptr_._1_7_,(byte)local_78.ss_.ptr_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x18);
    local_58 = local_58 + 1;
    if (local_58 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void check_op() {
  const char *inputs[] = {"foo", "fop", "fo"};
  std::size_t num_inputs = sizeof(inputs) / sizeof(*inputs);
  for (std::size_t i = 0; i < num_inputs; ++i) {
    for (std::size_t j = 0; j < num_inputs; ++j) {
      string_view lhs(inputs[i]), rhs(inputs[j]);
      EXPECT_EQ(Op<int>()(lhs.compare(rhs), 0), Op<string_view>()(lhs, rhs));
    }
  }
}